

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

NinePatchMargin * __thiscall NinePatchMargin::writeXml_abi_cxx11_(NinePatchMargin *this,int indent)

{
  int iVar1;
  ostream *poVar2;
  int in_EDX;
  undefined4 in_register_00000034;
  int *piVar3;
  Util local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [48];
  Util local_1c8 [32];
  stringstream local_1a8 [8];
  stringstream str;
  ostream local_198 [380];
  int local_1c;
  int *piStack_18;
  int indent_local;
  NinePatchMargin *this_local;
  
  piVar3 = (int *)CONCAT44(in_register_00000034,indent);
  local_1c = in_EDX;
  piStack_18 = piVar3;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  Util::getIndent_abi_cxx11_(local_1c8,local_1c);
  poVar2 = std::operator<<(local_198,(string *)local_1c8);
  poVar2 = std::operator<<(poVar2,"<NinePatchMargin>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_1c8);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"Top",&local_1f9);
  Util::writeXmlElement<int>((stringstream *)local_1a8,iVar1,(string *)local_1f8,*piVar3);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"Left",&local_221);
  Util::writeXmlElement<int>((stringstream *)local_1a8,iVar1,(string *)local_220,piVar3[2]);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"Right",&local_249);
  Util::writeXmlElement<int>((stringstream *)local_1a8,iVar1,(string *)local_248,piVar3[3]);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"Bottom",&local_271);
  Util::writeXmlElement<int>((stringstream *)local_1a8,iVar1,(string *)local_270,piVar3[1]);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  Util::getIndent_abi_cxx11_(local_298,local_1c);
  poVar2 = std::operator<<(local_198,(string *)local_298);
  poVar2 = std::operator<<(poVar2,"</NinePatchMargin>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_298);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

std::string NinePatchMargin::writeXml(int indent) const
{
	std::stringstream str;
	
	str << Util::getIndent(indent) << "<NinePatchMargin>" << std::endl;
	Util::writeXmlElement(str, indent + 1, "Top", top);
	Util::writeXmlElement(str, indent + 1, "Left", left);
	Util::writeXmlElement(str, indent + 1, "Right", right);
	Util::writeXmlElement(str, indent + 1, "Bottom", bottom);
	str << Util::getIndent(indent) << "</NinePatchMargin>" << std::endl;

	return str.str();
}